

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_impl.cc
# Opt level: O1

bool absl::lts_20250127::time_internal::cctz::time_zone::Impl::LoadTimeZone
               (string *name,time_zone *tz)

{
  bool bVar1;
  int iVar2;
  Impl *pIVar3;
  pthread_mutex_t *__mutex;
  iterator iVar4;
  Impl *pIVar5;
  mapped_type *ppIVar6;
  undefined8 uVar7;
  pointer __p;
  pointer *__ptr;
  byte unaff_BPL;
  unique_ptr<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl,_std::default_delete<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl>_>
  new_impl;
  duration<long,_std::ratio<1L,_1L>_> offset;
  Impl *local_48;
  Impl *local_40;
  seconds local_38;
  
  pIVar3 = UTCImpl();
  local_38.__r = 0;
  bVar1 = FixedOffsetFromName(name,&local_38);
  if ((bVar1) && (local_38.__r == 0)) {
    tz->impl_ = pIVar3;
    unaff_BPL = 1;
  }
  else {
    local_40 = pIVar3;
    __mutex = (pthread_mutex_t *)anon_unknown_7::TimeZoneMutex();
    iVar2 = pthread_mutex_lock(__mutex);
    if (iVar2 != 0) {
      iVar2 = std::__throw_system_error(iVar2);
LAB_0039866d:
      uVar7 = std::__throw_system_error(iVar2);
      pthread_mutex_unlock(__mutex);
      if (local_48 != (Impl *)0x0) {
        std::default_delete<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl>::
        operator()((default_delete<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl> *
                   )&local_48,local_48);
      }
      local_48 = (Impl *)0x0;
      _Unwind_Resume(uVar7);
    }
    if (cctz::(anonymous_namespace)::time_zone_map_abi_cxx11_ ==
        (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
         *)0x0) {
      bVar1 = true;
    }
    else {
      iVar4 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(cctz::(anonymous_namespace)::time_zone_map_abi_cxx11_,name);
      bVar1 = iVar4.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>,_true>
              ._M_cur == (__node_type *)0x0;
      if (!bVar1) {
        tz->impl_ = *(Impl **)((long)iVar4.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>,_true>
                                     ._M_cur + 0x28);
        unaff_BPL = *(Impl **)((long)iVar4.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>,_true>
                                     ._M_cur + 0x28) != pIVar3;
      }
    }
    pthread_mutex_unlock(__mutex);
    if (bVar1) {
      pIVar5 = (Impl *)operator_new(0x28);
      Impl(pIVar5,name);
      local_48 = pIVar5;
      __mutex = (pthread_mutex_t *)anon_unknown_7::TimeZoneMutex();
      iVar2 = pthread_mutex_lock(__mutex);
      if (iVar2 != 0) goto LAB_0039866d;
      if (cctz::(anonymous_namespace)::time_zone_map_abi_cxx11_ ==
          (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           *)0x0) {
        cctz::(anonymous_namespace)::time_zone_map_abi_cxx11_ =
             (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)operator_new(0x38);
        cctz::(anonymous_namespace)::time_zone_map_abi_cxx11_->_M_buckets =
             &cctz::(anonymous_namespace)::time_zone_map_abi_cxx11_->_M_single_bucket;
        cctz::(anonymous_namespace)::time_zone_map_abi_cxx11_->_M_bucket_count = 1;
        (cctz::(anonymous_namespace)::time_zone_map_abi_cxx11_->_M_before_begin)._M_nxt =
             (_Hash_node_base *)0x0;
        cctz::(anonymous_namespace)::time_zone_map_abi_cxx11_->_M_element_count = 0;
        (cctz::(anonymous_namespace)::time_zone_map_abi_cxx11_->_M_rehash_policy)._M_max_load_factor
             = 1.0;
        (cctz::(anonymous_namespace)::time_zone_map_abi_cxx11_->_M_rehash_policy)._M_next_resize = 0
        ;
        cctz::(anonymous_namespace)::time_zone_map_abi_cxx11_->_M_single_bucket =
             (__node_base_ptr)0x0;
      }
      ppIVar6 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::lts_20250127::time_internal::cctz::time_zone::Impl_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)cctz::(anonymous_namespace)::time_zone_map_abi_cxx11_,name);
      pIVar5 = local_48;
      if (*ppIVar6 == (mapped_type)0x0) {
        if ((local_48->zone_)._M_t.
            super___uniq_ptr_impl<absl::lts_20250127::time_internal::cctz::TimeZoneIf,_std::default_delete<absl::lts_20250127::time_internal::cctz::TimeZoneIf>_>
            ._M_t.
            super__Tuple_impl<0UL,_absl::lts_20250127::time_internal::cctz::TimeZoneIf_*,_std::default_delete<absl::lts_20250127::time_internal::cctz::TimeZoneIf>_>
            .super__Head_base<0UL,_absl::lts_20250127::time_internal::cctz::TimeZoneIf_*,_false>.
            _M_head_impl != (TimeZoneIf *)0x0) {
          local_48 = (Impl *)0x0;
          local_40 = pIVar5;
        }
        *ppIVar6 = local_40;
      }
      tz->impl_ = *ppIVar6;
      unaff_BPL = *ppIVar6 != pIVar3;
      pthread_mutex_unlock(__mutex);
      if (local_48 != (Impl *)0x0) {
        std::default_delete<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl>::
        operator()((default_delete<const_absl::lts_20250127::time_internal::cctz::time_zone::Impl> *
                   )&local_48,local_48);
      }
    }
  }
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool time_zone::Impl::LoadTimeZone(const std::string& name, time_zone* tz) {
  const Impl* const utc_impl = UTCImpl();

  // Check for UTC (which is never a key in time_zone_map).
  auto offset = seconds::zero();
  if (FixedOffsetFromName(name, &offset) && offset == seconds::zero()) {
    *tz = time_zone(utc_impl);
    return true;
  }

  // Check whether the time zone has already been loaded.
  {
    std::lock_guard<std::mutex> lock(TimeZoneMutex());
    if (time_zone_map != nullptr) {
      TimeZoneImplByName::const_iterator itr = time_zone_map->find(name);
      if (itr != time_zone_map->end()) {
        *tz = time_zone(itr->second);
        return itr->second != utc_impl;
      }
    }
  }

  // Load the new time zone (outside the lock).
  std::unique_ptr<const Impl> new_impl(new Impl(name));

  // Add the new time zone to the map.
  std::lock_guard<std::mutex> lock(TimeZoneMutex());
  if (time_zone_map == nullptr) time_zone_map = new TimeZoneImplByName;
  const Impl*& impl = (*time_zone_map)[name];
  if (impl == nullptr) {  // this thread won any load race
    impl = new_impl->zone_ ? new_impl.release() : utc_impl;
  }
  *tz = time_zone(impl);
  return impl != utc_impl;
}